

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

void Abc_TtAndCompl(word *pOut,word *pIn1,int fCompl1,word *pIn2,int fCompl2,int nWords)

{
  int local_34;
  int w;
  int nWords_local;
  int fCompl2_local;
  word *pIn2_local;
  int fCompl1_local;
  word *pIn1_local;
  word *pOut_local;
  
  if (fCompl1 == 0) {
    if (fCompl2 == 0) {
      for (local_34 = 0; local_34 < nWords; local_34 = local_34 + 1) {
        pOut[local_34] = pIn1[local_34] & pIn2[local_34];
      }
    }
    else {
      for (local_34 = 0; local_34 < nWords; local_34 = local_34 + 1) {
        pOut[local_34] = pIn1[local_34] & (pIn2[local_34] ^ 0xffffffffffffffff);
      }
    }
  }
  else if (fCompl2 == 0) {
    for (local_34 = 0; local_34 < nWords; local_34 = local_34 + 1) {
      pOut[local_34] = (pIn1[local_34] ^ 0xffffffffffffffff) & pIn2[local_34];
    }
  }
  else {
    for (local_34 = 0; local_34 < nWords; local_34 = local_34 + 1) {
      pOut[local_34] = (pIn1[local_34] ^ 0xffffffffffffffff) & (pIn2[local_34] ^ 0xffffffffffffffff)
      ;
    }
  }
  return;
}

Assistant:

static inline void Abc_TtAndCompl( word * pOut, word * pIn1, int fCompl1, word * pIn2, int fCompl2, int nWords )
{
    int w;
    if ( fCompl1 )
    {
        if ( fCompl2 )
            for ( w = 0; w < nWords; w++ )
                pOut[w] = ~pIn1[w] & ~pIn2[w];
        else
            for ( w = 0; w < nWords; w++ )
                pOut[w] = ~pIn1[w] & pIn2[w];
    }
    else
    {
        if ( fCompl2 )
            for ( w = 0; w < nWords; w++ )
                pOut[w] = pIn1[w] & ~pIn2[w];
        else
            for ( w = 0; w < nWords; w++ )
                pOut[w] = pIn1[w] & pIn2[w];
    }
}